

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_base_operation<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
               (void)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *column;
  Underlying_matrix *this;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Column_settings *pCVar12;
  Column_settings *pCVar13;
  pool<boost::default_user_allocator_malloc_free> *ppVar14;
  int dim;
  ulong uVar15;
  ulong uVar16;
  __hashtable *__h;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> m;
  key_equal local_9b;
  allocator_type local_9a;
  anon_class_1_0_00000001 local_99;
  anon_class_8_1_e4bd5e45 local_98;
  undefined4 local_90;
  anon_class_1_0_00000001 local_89;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_88;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> local_70;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ();
  ppVar14 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (ppVar14->super_simple_segregated_storage<unsigned_long>).first = (void *)0x0;
  (ppVar14->list).ptr = (char *)0x0;
  (ppVar14->list).sz = 0;
  ppVar14->requested_size = 0x18;
  ppVar14->next_size = 0x20;
  ppVar14->start_size = 0x20;
  ppVar14->max_size = 0;
  this = &local_70.matrix_;
  local_70.colSettings_ = (Column_settings *)ppVar14;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,((long)local_88.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_88.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               (hash<unsigned_int> *)&local_98,&local_9b,&local_9a);
  local_70.matrix_.nextInsertIndex_ =
       (int)((ulong)((long)local_88.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_88.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  local_70.matrix_.colSettings_ = (Column_settings *)ppVar14;
  if (local_88.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar16 = 0;
    do {
      column = local_88.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16;
      puVar2 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dim = (int)((ulong)((long)puVar2 - (long)puVar3) >> 2) + -1;
      if (puVar2 == puVar3) {
        dim = 0;
      }
      Gudhi::persistence_matrix::
      Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
      ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
                  *)this,column,(Index)uVar16,dim);
      uVar16 = (ulong)((Index)uVar16 + 1);
      uVar15 = ((long)local_88.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_88.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar16 <= uVar15 && uVar15 - uVar16 != 0);
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&local_88,&local_70);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_70.matrix_.matrix_._M_h._M_bucket_count;
  uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar6,0);
  if (local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var4 = local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var4[1]._M_nxt;
    while (uVar1 != 6) {
      p_Var4 = p_Var4->_M_nxt;
      if ((p_Var4 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var4[1]._M_nxt,
         (ulong)uVar1 % local_70.matrix_.matrix_._M_h._M_bucket_count != uVar16)) goto LAB_00174087;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_70.matrix_.matrix_._M_h._M_bucket_count;
    uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) % auVar7,0);
    if (local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var5 = local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var5[1]._M_nxt;
      goto joined_r0x00173d4d;
    }
  }
LAB_00174087:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x00173d4d:
  if (uVar1 == 7) {
    local_98.targetColumn =
         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
          *)(p_Var5 + 2);
    Gudhi::persistence_matrix::
    _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_ty___ons<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,false>&)_1_>
              ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
                *)(p_Var4 + 2),local_98.targetColumn,(anon_class_1_0_00000001 *)&local_9b,&local_98,
               (anon_class_1_0_00000001 *)&local_9a,&local_99,&local_89);
    local_98.targetColumn =
         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
          *)0x300000000;
    local_90 = 5;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               (local_88.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 7),&local_98);
    test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              (&local_88,&local_70);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_70.matrix_.matrix_._M_h._M_bucket_count;
    uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
    if (local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var4 = local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var4[1]._M_nxt;
      goto joined_r0x00173e0d;
    }
    goto LAB_00174087;
  }
  p_Var5 = p_Var5->_M_nxt;
  if ((p_Var5 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var5[1]._M_nxt,
     (ulong)uVar1 % local_70.matrix_.matrix_._M_h._M_bucket_count != uVar16)) goto LAB_00174087;
  goto joined_r0x00173d4d;
joined_r0x00173e0d:
  if (uVar1 == 3) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_70.matrix_.matrix_._M_h._M_bucket_count;
    uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10)) % auVar9,0);
    if (local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var5 = local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var5[1]._M_nxt;
      goto joined_r0x00173e57;
    }
    goto LAB_00174087;
  }
  p_Var4 = p_Var4->_M_nxt;
  if ((p_Var4 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var4[1]._M_nxt,
     (ulong)uVar1 % local_70.matrix_.matrix_._M_h._M_bucket_count != uVar16)) goto LAB_00174087;
  goto joined_r0x00173e0d;
joined_r0x00173e57:
  if (uVar1 == 10) {
    local_98.targetColumn =
         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
          *)(p_Var5 + 2);
    Gudhi::persistence_matrix::
    _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_ty___ons<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,false>&)_1_>
              ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
                *)(p_Var4 + 2),local_98.targetColumn,(anon_class_1_0_00000001 *)&local_9b,&local_98,
               (anon_class_1_0_00000001 *)&local_9a,&local_99,&local_89);
    local_98.targetColumn._0_4_ = 1;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               (local_88.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 10),&local_98);
    test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              (&local_88,&local_70);
    local_98.targetColumn._0_4_ = 3;
    local_9b = (key_equal)0x1;
    Gudhi::persistence_matrix::
    Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
    ::multiply_target_and_add_to<int>(this,(int *)&local_98,(Field_element *)&local_9b,5);
    local_98.targetColumn =
         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
          *)0x200000000;
    local_90 = 4;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               (local_88.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 5),&local_98);
    test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              (&local_88,&local_70);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_70.matrix_.matrix_._M_h._M_bucket_count;
    uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar10,0);
    if (local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var4 = local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var4[1]._M_nxt;
      goto joined_r0x00173f60;
    }
    goto LAB_00174087;
  }
  p_Var5 = p_Var5->_M_nxt;
  if ((p_Var5 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var5[1]._M_nxt,
     (ulong)uVar1 % local_70.matrix_.matrix_._M_h._M_bucket_count != uVar16)) goto LAB_00174087;
  goto joined_r0x00173e57;
joined_r0x00173f60:
  if (uVar1 == 6) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_70.matrix_.matrix_._M_h._M_bucket_count;
    uVar16 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
    if (local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var5 = local_70.matrix_.matrix_._M_h._M_buckets[uVar16 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var5[1]._M_nxt;
      do {
        if (uVar1 == 3) {
          local_98.targetColumn =
               (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
                *)(p_Var4 + 2);
          Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_ty___ons<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,false>&)_1_>
                    ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
                      *)(p_Var5 + 2),local_98.targetColumn,(anon_class_1_0_00000001 *)&local_9b,
                     &local_98,(anon_class_1_0_00000001 *)&local_9a,&local_99,&local_89);
          local_98.targetColumn._0_4_ = 1;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (local_88.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 6),&local_98);
          test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
                    (&local_88,&local_70);
          pCVar12 = local_70.colSettings_;
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this);
          pCVar13 = local_70.colSettings_;
          local_70.matrix_.nextInsertIndex_ = 0;
          local_70.matrix_.colSettings_ = pCVar12;
          if ((pool<boost::default_user_allocator_malloc_free> *)local_70.colSettings_ !=
              (pool<boost::default_user_allocator_malloc_free> *)0x0) {
            boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                      ((pool<boost::default_user_allocator_malloc_free> *)local_70.colSettings_);
          }
          operator_delete(pCVar13,0x38);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_88);
          return;
        }
        p_Var5 = p_Var5->_M_nxt;
      } while ((p_Var5 != (_Hash_node_base *)0x0) &&
              (uVar1 = *(uint *)&p_Var5[1]._M_nxt,
              (ulong)uVar1 % local_70.matrix_.matrix_._M_h._M_bucket_count == uVar16));
    }
    goto LAB_00174087;
  }
  p_Var4 = p_Var4->_M_nxt;
  if ((p_Var4 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var4[1]._M_nxt,
     (ulong)uVar1 % local_70.matrix_.matrix_._M_h._M_bucket_count != uVar16)) goto LAB_00174087;
  goto joined_r0x00173f60;
}

Assistant:

void test_base_operation() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.add_to(6, 7);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[7] = {0, 3, 5};
  } else {
    columns[7] = {{0, 1}, {3, 1}, {5, 4}};
  }
  test_content_equality(columns, m);

  if constexpr (!Matrix::isNonBasic) {
    m.add_to(m.get_column(3), 10);
    if constexpr (Matrix::Option_list::is_z2) {
      columns[10] = {1};
    } else {
      columns[10] = {{0, 2}, {1, 4}};
    }
    test_content_equality(columns, m);
  }

  m.multiply_target_and_add_to(3, 3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2, 4};
  } else {
    columns[5] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
  }
  test_content_equality(columns, m);

  m.multiply_source_and_add_to(3, 3, 6);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {1};
  } else {
    columns[6] = {{0, 4}, {1, 2}, {4, 2}};
  }
  test_content_equality(columns, m);
}